

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

String * __thiscall
Jinx::Impl::Parser::ParseMultiName_abi_cxx11_
          (String *__return_storage_ptr__,Parser *this,
          initializer_list<Jinx::Impl::SymbolType> symbols)

{
  SymbolType SVar1;
  pointer pSVar2;
  pointer pcVar3;
  Symbol *pSVar4;
  Symbol *pSVar5;
  long lVar6;
  
  if ((this->m_error == false) &&
     (pSVar2 = (this->m_currentSymbol)._M_current,
     pSVar2 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    if (pSVar2->type == NameValue) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pSVar2->text)._M_dataplus._M_p;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          __return_storage_ptr__,pcVar3,pcVar3 + (pSVar2->text)._M_string_length);
      while( true ) {
        pSVar4 = (this->m_currentSymbol)._M_current;
        this->m_lastLine = pSVar4->lineNumber;
        pSVar5 = pSVar4 + 1;
        (this->m_currentSymbol)._M_current = pSVar5;
        if (this->m_error != false) {
          return __return_storage_ptr__;
        }
        if ((this->m_symbolList->
            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
            super__Vector_impl_data._M_finish == pSVar5) {
          return __return_storage_ptr__;
        }
        SVar1 = pSVar5->type;
        if (SVar1 == NewLine) {
          return __return_storage_ptr__;
        }
        if (pSVar4[1].text._M_string_length == 0) break;
        if (SVar1 != NameValue && symbols._M_len != 0) {
          lVar6 = 0;
          do {
            if (SVar1 == *(SymbolType *)((long)symbols._M_array + lVar6)) {
              return __return_storage_ptr__;
            }
            lVar6 = lVar6 + 4;
          } while (symbols._M_len * 4 - lVar6 != 0);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__," ");
        pSVar5 = (this->m_currentSymbol)._M_current;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_append
                  (__return_storage_ptr__,(pSVar5->text)._M_dataplus._M_p,
                   (pSVar5->text)._M_string_length);
      }
      return __return_storage_ptr__;
    }
    Error<>(this,"Unexpected symbol type when parsing name");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseMultiName(std::initializer_list<SymbolType> symbols)
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing name");
			return String();
		}
		String s = String(m_currentSymbol->text);
		NextSymbol();

		while (IsSymbolValid(m_currentSymbol) && !m_currentSymbol->text.empty())
		{
			if (m_currentSymbol->type != SymbolType::NameValue)
			{
				for (auto symbol : symbols)
				{
					if (m_currentSymbol->type == symbol)
						return s;
				}
			}
			s += " ";
			s += m_currentSymbol->text;
			NextSymbol();
		}

		return s;
	}